

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

Simplex_handle __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::edge_with_same_filtration
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,Simplex_handle *sh)

{
  long lVar1;
  float fVar2;
  long lVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  Filtration_value *pFVar6;
  undefined8 *puVar7;
  char *pcVar8;
  undefined8 *in_RDX;
  int iVar9;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  SVar10;
  iterator __begin0;
  int w;
  Vertex_handle v;
  int v0;
  Siblings *local_128;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
  *local_120;
  __node_base_ptr local_118;
  Simplex_handle local_110;
  Simplex_handle local_108;
  Simplex_handle local_100;
  Simplex_vertex_range local_f8;
  Static_vertex_vector suffix;
  
  local_100.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
        *)*in_RDX;
  simplex_vertex_range
            (&local_f8,(Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)sh,&local_100);
  if (local_f8.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.v_ ==
      local_f8.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End.v_ &&
      local_f8.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.sib_ ==
      local_f8.
      super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End.sib_) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar8 = "empty simplex";
  }
  else {
    v0 = local_f8.
         super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
         .m_Begin.v_;
    iVar9 = (local_f8.
             super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin.sib_)->parent_;
    local_128 = (local_f8.
                 super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin.sib_)->oncles_;
    uVar4 = (local_f8.
             super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin.sib_)->oncles_;
    uVar5 = (local_f8.
             super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin.sib_)->parent_;
    SVar10.v_ = uVar5;
    SVar10.sib_ = (Siblings *)uVar4;
    if (iVar9 != local_f8.
                 super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                 .m_End.v_ ||
        local_128 !=
        local_f8.
        super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
        .m_End.sib_) {
      SVar10._12_4_ = 0;
      SVar10 = std::
               next<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>
                         (SVar10,1);
      if (SVar10.v_ ==
          local_f8.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End.v_ &&
          SVar10.sib_ ==
          local_f8.
          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End.sib_) {
        (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)*in_RDX;
      }
      else {
        local_120 = local_f8.
                    super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                    .m_End.sib_;
        suffix.
        super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
        .m_holder.m_size = 0;
        boost::container::
        vector<int,boost::container::dtl::static_storage_allocator<int,40ul,0ul,true>,void>::
        priv_push_back<int_const&>
                  ((vector<int,boost::container::dtl::static_storage_allocator<int,40ul,0ul,true>,void>
                    *)&suffix,&v0);
        local_108.m_ptr =
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)*in_RDX;
        pFVar6 = filtration_(&local_108);
        fVar2 = *pFVar6;
        local_118 = (__node_base_ptr)sh;
        do {
          v = iVar9;
          find_vertex((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&__begin0,
                      (Vertex_handle)local_118);
          lVar3 = *(long *)(__begin0.m_ptr + 4);
          lVar1 = suffix.
                  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                  .m_holder.m_size * 4;
          __begin0.m_ptr = (int *)&suffix;
          while (__begin0.m_ptr !=
                 (int *)((long)&suffix.
                                super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                                .m_holder.super_static_storage_allocator<int,_40UL,_0UL,_true>.
                                storage + lVar1)) {
            boost::container::vec_iterator<int_*,_false>::operator*(&__begin0);
            boost::container::dtl::
            flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_>_>
            ::find((flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_>_>
                    *)this,(key_type *)(lVar3 + 0x10));
            local_110.m_ptr =
                 (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                  *)(this->nodes_label_to_list_)._M_h._M_buckets;
            pFVar6 = filtration_(&local_110);
            if ((*pFVar6 == fVar2) && (!NAN(*pFVar6) && !NAN(fVar2))) {
              return (Simplex_handle)
                     (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                      *)this;
            }
            boost::container::vec_iterator<int_*,_false>::operator++(&__begin0);
          }
          boost::container::
          vector<int,boost::container::dtl::static_storage_allocator<int,40ul,0ul,true>,void>::
          priv_push_back<int_const&>
                    ((vector<int,boost::container::dtl::static_storage_allocator<int,40ul,0ul,true>,void>
                      *)&suffix,&v);
          iVar9 = local_128->parent_;
          local_128 = local_128->oncles_;
        } while (iVar9 != local_f8.
                          super_iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
                          .m_End.v_ || local_128 != local_120);
        (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
      }
      return (Simplex_handle)
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)this;
    }
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar8 = "simplex of dimension 0";
  }
  *puVar7 = pcVar8;
  __cxa_throw(puVar7,&char_const*::typeinfo,0);
}

Assistant:

Simplex_handle edge_with_same_filtration(Simplex_handle sh) const {
    // See issue #251 for potential speed improvements.
    auto&& vertices = simplex_vertex_range(sh); // vertices in decreasing order
    auto end = std::end(vertices);
    auto vi = std::begin(vertices);
    GUDHI_CHECK(vi != end, "empty simplex");
    auto v0 = *vi;
    ++vi;
    GUDHI_CHECK(vi != end, "simplex of dimension 0");
    if(std::next(vi) == end) return sh; // shortcut for dimension 1
    Static_vertex_vector suffix;
    suffix.push_back(v0);
    auto filt = filtration_(sh);
    do
    {
      Vertex_handle v = *vi;
      auto&& children1 = find_vertex(v)->second.children()->members_;
      for(auto w : suffix){
        // Can we take advantage of the fact that suffix is ordered?
        Simplex_handle s = children1.find(w);
        if(filtration_(s) == filt)
          return s;
      }
      suffix.push_back(v);
    }
    while(++vi != end);
    return null_simplex();
  }